

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rbuVfsSync(sqlite3_file *pFile,int flags)

{
  rbu_file *p;
  int flags_local;
  sqlite3_file *pFile_local;
  
  if ((pFile[3].pMethods == (sqlite3_io_methods *)0x0) || ((pFile[3].pMethods)->iVersion != 3)) {
    pFile_local._4_4_ = (**(code **)(*(long *)pFile[1].pMethods + 0x28))(pFile[1].pMethods,flags);
  }
  else if (((ulong)pFile[5].pMethods & 0x100) == 0) {
    pFile_local._4_4_ = 0;
  }
  else {
    pFile_local._4_4_ = 2;
  }
  return pFile_local._4_4_;
}

Assistant:

static int rbuVfsSync(sqlite3_file *pFile, int flags){
  rbu_file *p = (rbu_file *)pFile;
  if( p->pRbu && p->pRbu->eStage==RBU_STAGE_CAPTURE ){
    if( p->openFlags & SQLITE_OPEN_MAIN_DB ){
      return SQLITE_INTERNAL;
    }
    return SQLITE_OK;
  }
  return p->pReal->pMethods->xSync(p->pReal, flags);
}